

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_archive.hpp
# Opt level: O0

void __thiscall
pstore::serialize::archive::database_reader::get<unsigned_long,void>
          (database_reader *this,unsigned_long *v)

{
  typed_address<unsigned_long> addr;
  value_type v_00;
  unsigned_long distance;
  type puVar1;
  typed_address<unsigned_long> local_40;
  undefined1 local_38 [8];
  unique_pointer<const_unsigned_long> result;
  unsigned_long extra_for_alignment;
  unsigned_long *v_local;
  database_reader *this_local;
  
  v_00 = address::absolute(&this->addr_);
  distance = calc_alignment<unsigned_long>(v_00,8);
  if (distance < 8) {
    result._M_t.super___uniq_ptr_impl<const_unsigned_long,_void_(*)(const_unsigned_long_*)>._M_t.
    super__Tuple_impl<0UL,_const_unsigned_long_*,_void_(*)(const_unsigned_long_*)>.
    super__Head_base<0UL,_const_unsigned_long_*,_false>._M_head_impl =
         (unsigned_long *)address::operator+=(&this->addr_,distance);
    addr.a_.a_ = (address)this->db_;
    typed_address<unsigned_long>::typed_address(&local_40,(address)(this->addr_).a_);
    database::getrou<unsigned_long,void>((database *)local_38,addr);
    address::operator+=(&this->addr_,8);
    puVar1 = std::unique_ptr<const_unsigned_long,_void_(*)(const_unsigned_long_*)>::operator*
                       ((unique_ptr<const_unsigned_long,_void_(*)(const_unsigned_long_*)> *)local_38
                       );
    *v = *puVar1;
    std::unique_ptr<const_unsigned_long,_void_(*)(const_unsigned_long_*)>::~unique_ptr
              ((unique_ptr<const_unsigned_long,_void_(*)(const_unsigned_long_*)> *)local_38);
    return;
  }
  assert_failed("extra_for_alignment < sizeof (Ty)",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/db_archive.hpp"
                ,0x94);
}

Assistant:

void database_reader::get (Ty & v) {

                auto const extra_for_alignment = calc_alignment (addr_.absolute (), alignof (Ty));
                PSTORE_ASSERT (extra_for_alignment < sizeof (Ty));
                addr_ += extra_for_alignment;
                // Load the data.
                auto result = db_.getrou (typed_address<Ty> (addr_));
                addr_ += sizeof (Ty);
                // Copy to the destination.
                new (&v) Ty (*result);
            }